

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::transcode_uastc_to_bc4
               (uastc_block *src_blk,void *pDst,bool high_quality,uint32_t chan0)

{
  bool bVar1;
  unpacked_uastc_block *puVar2;
  unpacked_uastc_block *unaff_retaddr;
  uastc_block *in_stack_00000008;
  bool unpack_srgb;
  color32 block_pixels [4] [4];
  void *pBC4_block;
  uint32_t mode;
  unpacked_uastc_block unpacked_src_blk;
  undefined8 in_stack_fffffffffffffed8;
  uint32_t a;
  uint8_t *in_stack_fffffffffffffee0;
  unpacked_uastc_block *unpacked_blk;
  unpacked_uastc_block *local_118;
  unpacked_uastc_block local_108;
  int local_50;
  uint32_t in_stack_ffffffffffffffc4;
  uint8_t *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined1 in_stack_fffffffffffffffe;
  undefined1 in_stack_ffffffffffffffff;
  
  a = (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x148843);
  bVar1 = unpack_uastc(in_stack_00000008,unaff_retaddr,(bool)in_stack_ffffffffffffffff,
                       (bool)in_stack_fffffffffffffffe);
  if (bVar1) {
    local_108.m_astc.m_weights[0x25] = (undefined1)local_50;
    local_108.m_astc.m_weights[0x26] = local_50._1_1_;
    local_108.m_astc.m_weights[0x27] = local_50._2_1_;
    local_108.m_astc.m_weights[0x28] = local_50._3_1_;
    if (local_50 == 8) {
      write_bc4_solid_block(in_stack_fffffffffffffee0,a);
      bVar1 = true;
    }
    else {
      unpacked_blk = (unpacked_uastc_block *)(local_108.m_astc.m_weights + 0x19);
      puVar2 = &local_108;
      do {
        local_118 = puVar2;
        color32::color32((color32 *)local_118);
        puVar2 = (unpacked_uastc_block *)&(local_118->m_astc).m_subsets;
      } while (puVar2 != unpacked_blk);
      bVar1 = unpack_uastc(unpacked_blk,(color32 *)local_118,false);
      if (bVar1) {
        encode_bc4(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool transcode_uastc_to_bc4(const uastc_block& src_blk, void* pDst, bool high_quality, uint32_t chan0)
	{
		BASISU_NOTE_UNUSED(high_quality);

		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		void* pBC4_block = pDst;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			write_bc4_solid_block(static_cast<uint8_t*>(pBC4_block), unpacked_src_blk.m_solid_color.c[chan0]);
			return true;
		}

		color32 block_pixels[4][4];
		const bool unpack_srgb = false;
		if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
			return false;

		basist::encode_bc4(pBC4_block, &block_pixels[0][0].c[chan0], sizeof(color32));

		return true;
	}